

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_basic_explicit
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  String *pSVar1;
  undefined1 *puVar2;
  uint uVar3;
  ShaderProgram *pSVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LayoutBindingProgram *this_00;
  uint *puVar9;
  mapped_type_conflict *pmVar10;
  allocator<char> local_34a;
  allocator<char> local_349;
  LayoutBindingTestResult *local_348;
  uint local_33c;
  String local_338;
  String decl;
  String local_2f8;
  String local_2d8;
  StringVector list;
  long *local_288 [2];
  long local_278 [2];
  String local_268;
  IProgramContextSupplier *local_248;
  uint *local_240;
  long *local_238 [2];
  long local_228 [2];
  String local_218;
  vector<int,_std::allocator<int>_> bindings;
  String local_1e0;
  StringStream s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  undefined4 extraout_var_01;
  
  puVar2 = &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70;
  local_348 = __return_storage_ptr__;
  std::ios_base::ios_base((ios_base *)puVar2);
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
       glUniformMatrix3x2fv;
  s.super_ostringstream._328_8_ = 0;
  s.super_ostringstream._336_2_ = 0;
  s.super_ostringstream._344_8_ = 0;
  s.super_ostringstream._352_8_ = 0;
  s.super_ostringstream._360_8_ = 0;
  s.super_ostringstream._368_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&PTR__StringStream_020f2a68;
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
       &PTR__StringStream_020f2a90;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_338,this,0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
            (&decl,this,&local_338);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&s,decl._M_dataplus._M_p,decl._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)decl._M_dataplus._M_p != &decl.field_2) {
    operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  setTemplateParam(this,(this->m_stage).type,"UNIFORM_ACCESS",&decl);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)decl._M_dataplus._M_p != &decl.field_2) {
    operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  std::ios_base::~ios_base((ios_base *)puVar2);
  iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
  makeSparseRange(&bindings,this,iVar6,0);
  if (bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start <
      bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_248 = &this->super_IProgramContextSupplier;
    pSVar1 = &local_348->m_reason;
    paVar8 = &(local_348->m_reason).field_2;
    puVar9 = (uint *)bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    do {
      uVar3 = *puVar9;
      local_240 = puVar9;
      iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&s,*(char **)CONCAT44(extraout_var,iVar6),&local_349);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
                (&local_338,this,(ulong)uVar3);
      iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d8,*(char **)(CONCAT44(extraout_var_00,iVar6) + 0x18),&local_34a)
      ;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,this,0);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                (&local_2f8,this,
                 (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_238,this,0)
      ;
      local_288[0] = local_278;
      local_33c = uVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"float","");
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
                (&local_218,this,local_238,(string *)local_288);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                (&local_1e0,this,0);
      local_268._M_string_length = 0;
      local_268.field_2._M_local_buf[0] = '\0';
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      buildUniformDecl(&decl,this,(String *)&s,&local_338,&local_2d8,&local_2f8,&local_218,
                       &local_1e0,&local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,
                        CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                 local_268.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      puVar2 = &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      if (local_288[0] != local_278) {
        operator_delete(local_288[0],local_278[0] + 1);
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0],local_228[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      if (list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(list.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((list.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
          _vptr_basic_ostream != (_func_int **)puVar2) {
        operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        CONCAT71(s.super_ostringstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                                 s.super_ostringstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
      }
      setTemplateParam(this,(this->m_stage).type,"UNIFORM_DECL",&decl);
      updateTemplate(this,(this->m_stage).type);
      iVar6 = (*local_248->_vptr_IProgramContextSupplier[6])();
      this_00 = (LayoutBindingProgram *)CONCAT44(extraout_var_01,iVar6);
      iVar6 = (*this_00->_vptr_LayoutBindingProgram[2])(this_00);
      pSVar4 = this_00->m_program;
      if (iVar6 == 2) {
        if (((*pSVar4->m_shaders[5].
               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
               super__Vector_impl_data._M_start)->m_info).compileOk != true) goto LAB_00bbfae3;
LAB_00bbfa38:
        if ((pSVar4->m_program).m_info.linkOk == false) goto LAB_00bbfae3;
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                  ((String *)&s,this,0);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                  (&local_338,this,(String *)&s);
        if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream != (_func_int **)puVar2) {
          operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream,
                          CONCAT71(s.super_ostringstream.
                                   super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                                   s.super_ostringstream.
                                   super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
        }
        if (local_338._M_string_length == 0) {
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                    ((String *)&s,this,0);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,
                     (String *)&s);
        }
        else {
          s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
          _vptr_basic_ostream = (_func_int **)puVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&s,local_338._M_dataplus._M_p,
                     local_338._M_dataplus._M_p + local_338._M_string_length);
          std::__cxx11::string::append((char *)&s);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,
                     (String *)&s);
        }
        if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream != (_func_int **)puVar2) {
          operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream,
                          CONCAT71(s.super_ostringstream.
                                   super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                                   s.super_ostringstream.
                                   super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_48,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&list);
        (*this_00->_vptr_LayoutBindingProgram[3])((String *)&s,this_00,&local_48);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ ==
            (long)list.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)list.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5) {
          puVar9 = (uint *)std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                         *)&s,list.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
          bVar5 = true;
          if (local_33c != *puVar9) goto LAB_00bbfbdf;
        }
        else {
LAB_00bbfbdf:
          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2f8,"binding point did not match default","");
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                  *)&s,list.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
          generateLog<int,int>(&local_2d8,this,&local_2f8,*pmVar10,local_33c);
          local_348->m_passed = false;
          local_348->m_notRunForThisContext = false;
          (local_348->m_reason)._M_dataplus._M_p = (pointer)paVar8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)pSVar1,local_2d8._M_dataplus._M_p,
                     local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
          bVar5 = false;
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)&s);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&list);
      }
      else {
        if (((*pSVar4->m_shaders[1].
               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
               super__Vector_impl_data._M_start)->m_info).compileOk != false) goto LAB_00bbfa38;
LAB_00bbfae3:
        LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&s,this_00,false);
        local_348->m_passed = false;
        local_348->m_notRunForThisContext = false;
        (local_348->m_reason)._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pSVar1,
                   s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                   _vptr_basic_ostream,
                   s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ +
                   (long)s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream);
        if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream != (_func_int **)puVar2) {
          operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream,
                          CONCAT71(s.super_ostringstream.
                                   super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                                   s.super_ostringstream.
                                   super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
        }
        bVar5 = false;
      }
      (*this_00->_vptr_LayoutBindingProgram[1])(this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)decl._M_dataplus._M_p != &decl.field_2) {
        operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
      }
      if (!bVar5) goto LAB_00bbfd76;
      puVar9 = local_240 + 1;
    } while (puVar9 < bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  }
  puVar2 = &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0;
  local_348->m_passed = true;
  local_348->m_notRunForThisContext = false;
  (local_348->m_reason)._M_dataplus._M_p = (pointer)&(local_348->m_reason).field_2;
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)puVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_348->m_reason,puVar2,puVar2);
  if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
      != (_func_int **)puVar2) {
    operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    CONCAT71(s.super_ostringstream.
                             super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                             s.super_ostringstream.
                             super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
  }
LAB_00bbfd76:
  if (bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_348;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_basic_explicit()
{
	bool passed = true;

	{
		StringStream s;
		s << buildAccess(getDefaultUniformName()) << ";\n";
		setTemplateParam("UNIFORM_ACCESS", s.str());
	}

	std::vector<int> bindings = makeSparseRange(maxBindings());
	for (std::vector<int>::iterator it = bindings.begin(); it < bindings.end(); it++)
	{
		int	binding = *it;
		String decl =
			buildUniformDecl(String(getTestParameters().keyword), buildLayout(binding),
							 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
							 buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog());
		}

		StringVector  list;
		const String& s = buildBlockName(getDefaultUniformName());
		if (!s.empty())
			list.push_back(s + "_block");
		else
			list.push_back(getDefaultUniformName());

		StringIntMap bindingPoints = program->getBindingPoints(list);
		passed &= bindingPoints.size() == list.size() && (binding == bindingPoints[list[0]]);
		if (!passed)
		{
			return LayoutBindingTestResult(
				passed, generateLog(String("binding point did not match default"), bindingPoints[list[0]], binding));
		}
	}
	return true;
}